

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
generateVaryingSSBOShader_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GLenum shaderType,
          SsboArgs *args,TestLog *log)

{
  bool bVar1;
  ostream *poVar2;
  MessageBuilder *this_00;
  undefined4 in_register_00000014;
  int iVar3;
  MessageBuilder local_660;
  StringTemplate local_4e0;
  string local_4c0;
  string local_4a0 [32];
  string local_480 [36];
  undefined4 local_45c;
  StringTemplate local_458;
  string local_438;
  string local_418 [32];
  string local_3f8 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d8;
  undefined1 local_3a8 [8];
  string message;
  stringstream ssboString;
  ostream local_378;
  undefined1 local_200 [8];
  string sourceString;
  undefined1 local_1d0 [8];
  ostringstream source;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argsMap;
  TestLog *log_local;
  SsboArgs *args_local;
  GLenum shaderType_local;
  
  iVar3 = (int)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&source.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::__cxx11::string::string((string *)local_200);
  std::__cxx11::stringstream::stringstream((stringstream *)(message.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_3a8);
  bVar1 = NegativeTestShared::anon_unknown_0::args::SsboArgs::getMemberReorder
                    ((SsboArgs *)CONCAT44(in_register_00000014,shaderType));
  if (bVar1) {
    poVar2 = std::operator<<(&local_378,"\tmediump vec4 array_1[${MEMBER_FIXED_ARRAY}];\n");
    poVar2 = std::operator<<(poVar2,"\thighp mat4 ${MEMBER_NAME};\n");
    poVar2 = std::operator<<(poVar2,"\tlowp ${MEMBER_TYPE} data;\n");
    std::operator<<(poVar2,"\tmediump float array_2[${MEMBER_VARIABLE_ARRAY}];\n");
  }
  else {
    poVar2 = std::operator<<(&local_378,"\tlowp ${MEMBER_TYPE} data;\n");
    poVar2 = std::operator<<(poVar2,"\thighp mat4 ${MEMBER_NAME};\n");
    poVar2 = std::operator<<(poVar2,"\tmediump vec4 array_1[${MEMBER_FIXED_ARRAY}];\n");
    std::operator<<(poVar2,"\tmediump float array_2[${MEMBER_VARIABLE_ARRAY}];\n");
  }
  (anonymous_namespace)::args::SsboArgs::populateArgsMap_abi_cxx11_
            (&local_3d8,(SsboArgs *)CONCAT44(in_register_00000014,shaderType));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&source.field_0x170,&local_3d8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_3d8);
  if (iVar3 == 0x8b30) {
    poVar2 = std::operator<<((ostream *)local_1d0,"${NEGATIVE_CONTEXT_VERSION}\n");
    poVar2 = std::operator<<(poVar2,"in mediump vec4 vertex_colour;\n");
    poVar2 = std::operator<<(poVar2,"layout (location = 0) out mediump vec4 fragment_colour;\n");
    poVar2 = std::operator<<(poVar2,
                             "layout (${STD_FORMAT}, binding = ${BINDING_POINT}, ${MATRIX_ORDER}) buffer ssbo_block\n"
                            );
    std::operator<<(poVar2,"{\n");
    std::__cxx11::stringstream::str();
    std::operator<<((ostream *)local_1d0,local_480);
    std::__cxx11::string::~string(local_480);
    poVar2 = std::operator<<((ostream *)local_1d0,"} ssbo;\n");
    poVar2 = std::operator<<(poVar2,"void main()\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"\tmediump vec4 variable;\n");
    poVar2 = std::operator<<(poVar2,"\tvariable * ssbo.${MEMBER_NAME};\n");
    poVar2 = std::operator<<(poVar2,"\tfor (int idx = 0; idx < ${MEMBER_FIXED_ARRAY}; idx++)\n");
    poVar2 = std::operator<<(poVar2,"\t{\n");
    poVar2 = std::operator<<(poVar2,"\t\tvariable += ssbo.array_1[idx];\n");
    poVar2 = std::operator<<(poVar2,"\t}\n");
    poVar2 = std::operator<<(poVar2,"\tfragment_colour = vertex_colour + variable;\n");
    std::operator<<(poVar2,"}\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)local_200,local_4a0);
    std::__cxx11::string::~string(local_4a0);
    tcu::StringTemplate::StringTemplate(&local_4e0,(string *)local_200);
    tcu::StringTemplate::specialize
              (&local_4c0,&local_4e0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&source.field_0x170);
    std::__cxx11::string::operator=((string *)local_200,(string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    tcu::StringTemplate::~StringTemplate(&local_4e0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_200);
  }
  else if (iVar3 == 0x8b31) {
    poVar2 = std::operator<<((ostream *)local_1d0,"${NEGATIVE_CONTEXT_VERSION}\n");
    poVar2 = std::operator<<(poVar2,"layout (location = 0) in highp vec4 position;\n");
    poVar2 = std::operator<<(poVar2,"layout (location = 1) in mediump vec4 colour;\n");
    poVar2 = std::operator<<(poVar2,"out mediump vec4 vertex_colour;\n");
    poVar2 = std::operator<<(poVar2,
                             "layout (${STD_FORMAT}, binding = ${BINDING_POINT}, ${MATRIX_ORDER}) buffer ssbo_block\n"
                            );
    std::operator<<(poVar2,"{\n");
    std::__cxx11::stringstream::str();
    std::operator<<((ostream *)local_1d0,local_3f8);
    std::__cxx11::string::~string(local_3f8);
    poVar2 = std::operator<<((ostream *)local_1d0,"} ssbo;\n");
    poVar2 = std::operator<<(poVar2,"void main()\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"\tmediump vec4 variable;\n");
    poVar2 = std::operator<<(poVar2,"\tgl_Position = ssbo.${MEMBER_NAME} * position;\n");
    poVar2 = std::operator<<(poVar2,"\tfor (int idx = 0; idx < ${MEMBER_FIXED_ARRAY}; idx++)\n");
    poVar2 = std::operator<<(poVar2,"\t{\n");
    poVar2 = std::operator<<(poVar2,"\t\tvariable += ssbo.array_1[idx];\n");
    poVar2 = std::operator<<(poVar2,"\t}\n");
    poVar2 = std::operator<<(poVar2,"\tvertex_colour = colour + variable;\n");
    std::operator<<(poVar2,"}\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)local_200,local_418);
    std::__cxx11::string::~string(local_418);
    tcu::StringTemplate::StringTemplate(&local_458,(string *)local_200);
    tcu::StringTemplate::specialize
              (&local_438,&local_458,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&source.field_0x170);
    std::__cxx11::string::operator=((string *)local_200,(string *)&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    tcu::StringTemplate::~StringTemplate(&local_458);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_200);
  }
  else if (iVar3 == 0x8dd9) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_200);
  }
  else if (iVar3 == 0x8e87) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_200);
  }
  else if (iVar3 == 0x8e88) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_200);
  }
  else if (iVar3 == 0x91b9) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_200);
  }
  else {
    std::__cxx11::string::operator=((string *)local_3a8,"shader type not recognised.");
    tcu::TestLog::operator<<(&local_660,(TestLog *)args,(BeginMessageToken *)&tcu::TestLog::Message)
    ;
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_660,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3a8);
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_660);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  local_45c = 1;
  std::__cxx11::string::~string((string *)local_3a8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(message.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&source.field_0x170);
  return __return_storage_ptr__;
}

Assistant:

std::string generateVaryingSSBOShader(const glw::GLenum shaderType, const args::SsboArgs& args, tcu::TestLog& log)
{
	std::map<std::string, std::string>	argsMap;
	std::ostringstream					source;
	std::string							sourceString;
	std::stringstream					ssboString;
	std::string							message;

	if (args.getMemberReorder())
	{
		ssboString	<< "	mediump vec4 array_1[${MEMBER_FIXED_ARRAY}];\n"
					<< "	highp mat4 ${MEMBER_NAME};\n"
					<< "	lowp ${MEMBER_TYPE} data;\n"
					<< "	mediump float array_2[${MEMBER_VARIABLE_ARRAY}];\n";
	}
	else
	{
		ssboString	<< "	lowp ${MEMBER_TYPE} data;\n"
					<< "	highp mat4 ${MEMBER_NAME};\n"
					<< "	mediump vec4 array_1[${MEMBER_FIXED_ARRAY}];\n"
					<< "	mediump float array_2[${MEMBER_VARIABLE_ARRAY}];\n";
	}

	argsMap = args.populateArgsMap();

	switch (shaderType)
	{
		case GL_VERTEX_SHADER:
		{
			source	<< "${NEGATIVE_CONTEXT_VERSION}\n"
					<< "layout (location = 0) in highp vec4 position;\n"
					<< "layout (location = 1) in mediump vec4 colour;\n"
					<< "out mediump vec4 vertex_colour;\n"
					<< "layout (${STD_FORMAT}, binding = ${BINDING_POINT}, ${MATRIX_ORDER}) buffer ssbo_block\n"
					<< "{\n";

			source << ssboString.str();

			source	<< "} ssbo;\n"
					<< "void main()\n"
					<< "{\n"
					<< "	mediump vec4 variable;\n"
					<< "	gl_Position = ssbo.${MEMBER_NAME} * position;\n"
					<< "	for (int idx = 0; idx < ${MEMBER_FIXED_ARRAY}; idx++)\n"
					<< "	{\n"
					<< "		variable += ssbo.array_1[idx];\n"
					<< "	}\n"
					<< "	vertex_colour = colour + variable;\n"
					<< "}\n";

			sourceString = source.str();
			sourceString = tcu::StringTemplate(sourceString).specialize(argsMap);

			return sourceString;
		}

		case GL_FRAGMENT_SHADER:
		{
			source	<< "${NEGATIVE_CONTEXT_VERSION}\n"
					<< "in mediump vec4 vertex_colour;\n"
					<< "layout (location = 0) out mediump vec4 fragment_colour;\n"
					<< "layout (${STD_FORMAT}, binding = ${BINDING_POINT}, ${MATRIX_ORDER}) buffer ssbo_block\n"
					<< "{\n";

			source << ssboString.str();

			source	<< "} ssbo;\n"
					<< "void main()\n"
					<< "{\n"
					<< "	mediump vec4 variable;\n"
					<< "	variable * ssbo.${MEMBER_NAME};\n"
					<< "	for (int idx = 0; idx < ${MEMBER_FIXED_ARRAY}; idx++)\n"
					<< "	{\n"
					<< "		variable += ssbo.array_1[idx];\n"
					<< "	}\n"
					<< "	fragment_colour = vertex_colour + variable;\n"
					<< "}\n";

			sourceString = source.str();
			sourceString = tcu::StringTemplate(sourceString).specialize(argsMap);

			return sourceString;
		}

		case GL_GEOMETRY_SHADER:
		{
			// TODO:
			return sourceString;
		}

		case GL_TESS_CONTROL_SHADER:
		{
			// TODO:
			return sourceString;
		}

		case GL_TESS_EVALUATION_SHADER:
		{
			// TODO:
			return sourceString;
		}

		case GL_COMPUTE_SHADER:
		{
			// TODO:
			return sourceString;
		}

		default:
		{
			message = "shader type not recognised.";
			log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		}
	}

	return std::string();
}